

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O2

size_t fiobj_each2(FIOBJ o,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  size_t data;
  fiobj_stack_s stack;
  _func_int_FIOBJ_void_ptr *local_58;
  void *local_50;
  undefined1 *local_48;
  FIOBJ local_40;
  size_t local_38;
  char local_30;
  char local_2f;
  
  if (((((~(uint)o & 6) == 0) || (o == 0)) || ((o & 1) != 0)) ||
     (pfVar2 = fiobj_type_vtable(o),
     pfVar2->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)) {
    (*task)(o,arg);
  }
  else {
    iVar1 = (*task)(o,arg);
    if (iVar1 != -1) {
      stack.capa = 0;
      stack.arry = (FIOBJ *)0x0;
      stack.start = 0;
      stack.end = 0;
      local_40 = 0;
      local_38 = 1;
      local_30 = '\0';
      data = 0;
      local_58 = task;
      local_50 = arg;
      local_48 = (undefined1 *)&stack;
      do {
        if (data == 0) {
          local_40 = 0;
        }
        local_2f = '\0';
        pfVar2 = fiobj_type_vtable(o);
        data = (*pfVar2->each)(o,data,fiobj_task_wrapper,&local_58);
        if (local_30 != '\0') break;
        if (local_2f != '\0') {
          fiobj_stack_push(&stack,data);
          fiobj_stack_push(&stack,o);
        }
        if (local_40 != 0) {
          fiobj_stack_push(&stack,0);
          fiobj_stack_push(&stack,local_40);
        }
        if (stack.end == stack.start) {
          o = 0;
        }
        else {
          o = stack.arry[stack.end - 1];
          stack.end = stack.end - 1;
        }
        if (stack.end != stack.start) {
          data = stack.arry[stack.end - 1];
          stack.end = stack.end - 1;
        }
      } while (o != 0);
      fiobj_stack_free(&stack);
      return local_38;
    }
  }
  return 1;
}

Assistant:

size_t fiobj_each2(FIOBJ o, int (*task)(FIOBJ obj, void *arg), void *arg) {
  if (!o || !FIOBJ_IS_ALLOCATED(o) || (FIOBJECT2VTBL(o)->each == NULL)) {
    task(o, arg);
    return 1;
  }
  /* run task for root object */
  if (task(o, arg) == -1)
    return 1;
  uintptr_t pos = 0;
  fiobj_stack_s stack = FIO_ARY_INIT;
  struct task_packet_s packet = {
      .task = task,
      .arg = arg,
      .stack = &stack,
      .counter = 1,
  };
  do {
    if (!pos)
      packet.next = 0;
    packet.incomplete = 0;
    pos = FIOBJECT2VTBL(o)->each(o, pos, fiobj_task_wrapper, &packet);
    if (packet.stop)
      goto finish;
    if (packet.incomplete) {
      fiobj_stack_push(&stack, pos);
      fiobj_stack_push(&stack, o);
    }

    if (packet.next) {
      fiobj_stack_push(&stack, (FIOBJ)0);
      fiobj_stack_push(&stack, packet.next);
    }
    o = FIOBJ_INVALID;
    fiobj_stack_pop(&stack, &o);
    fiobj_stack_pop(&stack, &pos);
  } while (o);
finish:
  fiobj_stack_free(&stack);
  return packet.counter;
}